

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinscachepair_tests.cpp
# Opt level: O0

list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
* coinscachepair_tests::CreatePairs_abi_cxx11_(CoinsCachePair *sentinel)

{
  bool bVar1;
  list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  int i;
  list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  *nodes;
  _List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_> node;
  char *in_stack_fffffffffffffcf8;
  _List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_> in_stack_fffffffffffffd00;
  char *in_stack_fffffffffffffd08;
  CCoinsCacheEntry *in_stack_fffffffffffffd10;
  _List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_> in_stack_fffffffffffffd20;
  lazy_ostream *in_stack_fffffffffffffd28;
  const_string *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  int local_220;
  reference local_1f8;
  CoinsCachePair *local_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [64];
  reference local_198;
  _List_node_base *local_190;
  _List_node_base *local_188;
  CoinsCachePair *local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [64];
  reference local_128;
  CoinsCachePair *local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [64];
  undefined1 local_c8 [8];
  CoinsCachePair *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [64];
  undefined1 local_68;
  undefined1 uStack_67;
  undefined1 uStack_66;
  undefined1 uStack_65;
  uint8_t local_61;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::
  list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  ::list((list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
          *)in_stack_fffffffffffffcf8);
  for (local_220 = 0; local_220 < 4; local_220 = local_220 + 1) {
    std::__cxx11::
    list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
    ::emplace_back<>((list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
                      *)in_stack_fffffffffffffd08);
    std::__cxx11::
    list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
    ::end((list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
           *)in_stack_fffffffffffffd00._M_node);
    local_10 = std::prev<std::_List_iterator<std::pair<COutPoint_const,CCoinsCacheEntry>>>
                         (in_stack_fffffffffffffd00,(difference_type)in_stack_fffffffffffffcf8);
    std::_List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>::operator->
              ((_List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_> *)
               in_stack_fffffffffffffcf8);
    std::_List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>::operator*
              ((_List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_> *)
               in_stack_fffffffffffffcf8);
    CCoinsCacheEntry::AddFlags
              (in_stack_fffffffffffffd10,(uint8_t)((ulong)in_stack_fffffffffffffd08 >> 0x38),
               (CoinsCachePair *)in_stack_fffffffffffffd00._M_node,
               (CoinsCachePair *)in_stack_fffffffffffffcf8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
                 (pointer)in_stack_fffffffffffffd00._M_node,(unsigned_long)in_stack_fffffffffffffcf8
                );
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                 in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,
                 (const_string *)in_stack_fffffffffffffd20._M_node);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffd00._M_node,
                 (char (*) [1])in_stack_fffffffffffffcf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
                 (pointer)in_stack_fffffffffffffd00._M_node,(unsigned_long)in_stack_fffffffffffffcf8
                );
      std::_List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>::operator->
                ((_List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_> *)
                 in_stack_fffffffffffffcf8);
      local_61 = CCoinsCacheEntry::GetFlags((CCoinsCacheEntry *)in_stack_fffffffffffffcf8);
      local_68 = '\x01';
      uStack_67 = '\0';
      uStack_66 = '\0';
      uStack_65 = '\0';
      in_stack_fffffffffffffd08 = "CCoinsCacheEntry::DIRTY";
      in_stack_fffffffffffffd00._M_node = (_List_node_base *)&stack0xffffffffffffff98;
      in_stack_fffffffffffffcf8 = "node->second.GetFlags()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,CCoinsCacheEntry::Flags>
                (&stack0xffffffffffffffb0,&stack0xffffffffffffffa0,0x18,1,2,&stack0xffffffffffffff9f
                );
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffffcf8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
                 (pointer)in_stack_fffffffffffffd00._M_node,(unsigned_long)in_stack_fffffffffffffcf8
                );
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                 in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,
                 (const_string *)in_stack_fffffffffffffd20._M_node);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffd00._M_node,
                 (char (*) [1])in_stack_fffffffffffffcf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
                 (pointer)in_stack_fffffffffffffd00._M_node,(unsigned_long)in_stack_fffffffffffffcf8
                );
      std::_List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>::operator->
                ((_List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_> *)
                 in_stack_fffffffffffffcf8);
      local_c0 = CCoinsCacheEntry::Next((CCoinsCacheEntry *)in_stack_fffffffffffffd08);
      in_stack_fffffffffffffd08 = "&sentinel";
      in_stack_fffffffffffffd00._M_node = (_List_node_base *)local_c8;
      in_stack_fffffffffffffcf8 = "node->second.Next()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
                (local_a8,local_b8,0x19,1,2,&local_c0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffffcf8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
                 (pointer)in_stack_fffffffffffffd00._M_node,(unsigned_long)in_stack_fffffffffffffcf8
                );
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                 in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,
                 (const_string *)in_stack_fffffffffffffd20._M_node);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffd00._M_node,
                 (char (*) [1])in_stack_fffffffffffffcf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
                 (pointer)in_stack_fffffffffffffd00._M_node,(unsigned_long)in_stack_fffffffffffffcf8
                );
      local_120 = CCoinsCacheEntry::Prev((CCoinsCacheEntry *)in_stack_fffffffffffffd08);
      local_128 = std::_List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>::operator*
                            ((_List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_> *)
                             in_stack_fffffffffffffcf8);
      in_stack_fffffffffffffd08 = "&(*node)";
      in_stack_fffffffffffffd00._M_node = (_List_node_base *)&local_128;
      in_stack_fffffffffffffcf8 = "sentinel.second.Prev()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
                (local_108,local_118,0x1a,1,2,&local_120);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffffcf8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    if (0 < local_220) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
                   (pointer)in_stack_fffffffffffffd00._M_node,
                   (unsigned_long)in_stack_fffffffffffffcf8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                   in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,
                   (const_string *)in_stack_fffffffffffffd20._M_node);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_fffffffffffffd00._M_node,
                   (char (*) [1])in_stack_fffffffffffffcf8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
                   (pointer)in_stack_fffffffffffffd00._M_node,
                   (unsigned_long)in_stack_fffffffffffffcf8);
        local_190 = (_List_node_base *)local_10;
        local_188 = (_List_node_base *)
                    std::prev<std::_List_iterator<std::pair<COutPoint_const,CCoinsCacheEntry>>>
                              (in_stack_fffffffffffffd00,(difference_type)in_stack_fffffffffffffcf8)
        ;
        std::_List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>::operator->
                  ((_List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_> *)
                   in_stack_fffffffffffffcf8);
        local_180 = CCoinsCacheEntry::Next((CCoinsCacheEntry *)in_stack_fffffffffffffd08);
        local_198 = std::_List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>::operator*
                              ((_List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_> *)
                               in_stack_fffffffffffffcf8);
        in_stack_fffffffffffffd08 = "&(*node)";
        in_stack_fffffffffffffd00._M_node = (_List_node_base *)&local_198;
        in_stack_fffffffffffffcf8 = "std::prev(node)->second.Next()";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
                  (local_168,local_178,0x1d,1,2,&local_180);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_fffffffffffffcf8);
        in_stack_fffffffffffffd3f = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_fffffffffffffd3f);
      do {
        in_stack_fffffffffffffd30 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
                   (pointer)in_stack_fffffffffffffd00._M_node,
                   (unsigned_long)in_stack_fffffffffffffcf8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                   in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,
                   (const_string *)in_stack_fffffffffffffd20._M_node);
        in_stack_fffffffffffffd28 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_fffffffffffffd00._M_node,
                   (char (*) [1])in_stack_fffffffffffffcf8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
                   (pointer)in_stack_fffffffffffffd00._M_node,
                   (unsigned_long)in_stack_fffffffffffffcf8);
        std::_List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>::operator->
                  ((_List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_> *)
                   in_stack_fffffffffffffcf8);
        local_1f0 = CCoinsCacheEntry::Prev((CCoinsCacheEntry *)in_stack_fffffffffffffd08);
        in_stack_fffffffffffffd20 =
             std::prev<std::_List_iterator<std::pair<COutPoint_const,CCoinsCacheEntry>>>
                       (in_stack_fffffffffffffd00,(difference_type)in_stack_fffffffffffffcf8);
        local_1f8 = std::_List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>::operator*
                              ((_List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_> *)
                               in_stack_fffffffffffffcf8);
        in_stack_fffffffffffffd08 = "&(*std::prev(node))";
        in_stack_fffffffffffffd00._M_node = (_List_node_base *)&local_1f8;
        in_stack_fffffffffffffcf8 = "node->second.Prev()";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
                  (local_1d8,local_1e8,0x1e,1,2,&local_1f0);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_fffffffffffffcf8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::list<CoinsCachePair> CreatePairs(CoinsCachePair& sentinel)
{
    std::list<CoinsCachePair> nodes;
    for (auto i{0}; i < NUM_NODES; ++i) {
        nodes.emplace_back();

        auto node{std::prev(nodes.end())};
        node->second.AddFlags(CCoinsCacheEntry::DIRTY, *node, sentinel);

        BOOST_CHECK_EQUAL(node->second.GetFlags(), CCoinsCacheEntry::DIRTY);
        BOOST_CHECK_EQUAL(node->second.Next(), &sentinel);
        BOOST_CHECK_EQUAL(sentinel.second.Prev(), &(*node));

        if (i > 0) {
            BOOST_CHECK_EQUAL(std::prev(node)->second.Next(), &(*node));
            BOOST_CHECK_EQUAL(node->second.Prev(), &(*std::prev(node)));
        }
    }
    return nodes;
}